

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makePointer(Builder *this,StorageClass storageClass,Id pointee)

{
  int iVar1;
  StorageClass SVar2;
  Id IVar3;
  size_type sVar4;
  reference ppIVar5;
  Instruction *this_00;
  undefined4 in_register_00000034;
  size_t size;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_48 [3];
  int local_2c;
  Instruction *pIStack_28;
  int t;
  Instruction *type;
  Id pointee_local;
  StorageClass storageClass_local;
  Builder *this_local;
  
  size = CONCAT44(in_register_00000034,storageClass);
  local_2c = 0;
  type._0_4_ = pointee;
  type._4_4_ = storageClass;
  _pointee_local = this;
  do {
    iVar1 = local_2c;
    sVar4 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
            size(this->groupedTypes + 0x20);
    if ((int)sVar4 <= iVar1) {
      this_00 = (Instruction *)Instruction::operator_new((Instruction *)0x38,size);
      IVar3 = getUniqueId(this);
      Instruction::Instruction(this_00,IVar3,0,OpTypePointer);
      pIStack_28 = this_00;
      Instruction::addImmediateOperand(this_00,type._4_4_);
      Instruction::addIdOperand(pIStack_28,(Id)type);
      std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
      push_back(this->groupedTypes + 0x20,&stack0xffffffffffffffd8);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_48,
                 pIStack_28);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,(value_type *)local_48);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (local_48);
      Module::mapInstruction(&this->module,pIStack_28);
      IVar3 = Instruction::getResultId(pIStack_28);
      return IVar3;
    }
    ppIVar5 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
              operator[](this->groupedTypes + 0x20,(long)local_2c);
    pIStack_28 = *ppIVar5;
    size = 0;
    SVar2 = Instruction::getImmediateOperand(pIStack_28,0);
    if (SVar2 == type._4_4_) {
      size = 1;
      IVar3 = Instruction::getIdOperand(pIStack_28,1);
      if (IVar3 == (Id)type) {
        IVar3 = Instruction::getResultId(pIStack_28);
        return IVar3;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

Id Builder::makePointer(StorageClass storageClass, Id pointee)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypePointer].size(); ++t) {
        type = groupedTypes[OpTypePointer][t];
        if (type->getImmediateOperand(0) == (unsigned)storageClass &&
            type->getIdOperand(1) == pointee)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypePointer);
    type->addImmediateOperand(storageClass);
    type->addIdOperand(pointee);
    groupedTypes[OpTypePointer].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}